

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend_openssl.cpp
# Opt level: O0

void __thiscall QTlsBackendOpenSSL::ensureCiphersAndCertsLoaded(QTlsBackendOpenSSL *this)

{
  initializer_list<QString> args;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char16_t *in_RDI;
  long in_FS_OFFSET;
  QByteArray *dir;
  QList<QByteArray> *__range1;
  QDirListing dirList;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList symLinkFilter;
  QList<QByteArray> dirs;
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_plugins_tls_openssl_qtlsbackend_openssl_cpp:195:30)>
  guard;
  QMutexLocker<QRecursiveMutex> locker;
  undefined4 in_stack_fffffffffffffed8;
  IteratorFlag in_stack_fffffffffffffedc;
  QMutexLocker<QRecursiveMutex> *in_stack_fffffffffffffee0;
  QList<QString> *in_stack_fffffffffffffee8;
  QMutexLocker<QRecursiveMutex> *pQVar4;
  iterator in_stack_fffffffffffffef0;
  undefined1 local_c8 [24];
  DirEntry local_b0;
  uint local_a4;
  undefined1 local_a0 [24];
  undefined8 local_88;
  QByteArray *local_80;
  const_iterator local_78;
  const_iterator local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined2 local_32;
  undefined8 local_30;
  undefined8 local_28;
  QMutexLocker<QRecursiveMutex> local_20;
  QRecursiveMutex *local_8;
  
  local_8 = *(QRecursiveMutex **)(in_FS_OFFSET + 0x28);
  if ((ensureCiphersAndCertsLoaded()::initMutex == '\0') &&
     (iVar2 = __cxa_guard_acquire(&ensureCiphersAndCertsLoaded()::initMutex), iVar2 != 0)) {
    __cxa_atexit(QRecursiveMutex::~QRecursiveMutex,&ensureCiphersAndCertsLoaded::initMutex,
                 &__dso_handle);
    __cxa_guard_release(&ensureCiphersAndCertsLoaded()::initMutex);
  }
  iVar2 = QBasicAtomicInteger<int>::loadAcquire((QBasicAtomicInteger<int> *)0x1263b7);
  if (iVar2 == 0) {
    local_30 = 0xaaaaaaaaaaaaaaaa;
    local_28 = 0xaaaaaaaaaaaaaaaa;
    QMutexLocker<QRecursiveMutex>::QMutexLocker
              (in_stack_fffffffffffffee0,
               (QRecursiveMutex *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if (((ensureCiphersAndCertsLoaded::initializationStarted & 1U) == 0) &&
       (iVar2 = QBasicAtomicInteger<int>::loadAcquire((QBasicAtomicInteger<int> *)0x126408),
       iVar2 == 0)) {
      ensureCiphersAndCertsLoaded::initializationStarted = true;
      local_32 = 0xaaaa;
      qScopeGuard<QTlsBackendOpenSSL::ensureCiphersAndCertsLoaded()const::__0>
                ((anon_class_1_0_00000001_for_m_func *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      resetDefaultCiphers();
      QTlsBackend::resetDefaultEllipticCurves();
      local_50 = 0xaaaaaaaaaaaaaaaa;
      local_48 = 0xaaaaaaaaaaaaaaaa;
      local_40 = 0xaaaaaaaaaaaaaaaa;
      QSslSocketPrivate::unixRootCertDirectories();
      local_68 = 0xaaaaaaaaaaaaaaaa;
      local_60 = 0xaaaaaaaaaaaaaaaa;
      local_58 = 0xaaaaaaaaaaaaaaaa;
      Qt::Literals::StringLiterals::operator____s(in_RDI,(size_t)in_stack_fffffffffffffef0);
      args._M_len = (size_type)in_RDI;
      args._M_array = in_stack_fffffffffffffef0;
      QList<QString>::QList(in_stack_fffffffffffffee8,args);
      pQVar4 = &local_20;
      in_stack_fffffffffffffee0 = (QMutexLocker<QRecursiveMutex> *)&stack0xfffffffffffffff8;
      do {
        in_stack_fffffffffffffee0 =
             (QMutexLocker<QRecursiveMutex> *)&in_stack_fffffffffffffee0[-2].m_isLocked;
        QString::~QString((QString *)0x126525);
      } while (in_stack_fffffffffffffee0 != pQVar4);
      local_70.i = (QByteArray *)0xaaaaaaaaaaaaaaaa;
      local_70 = QList<QByteArray>::begin((QList<QByteArray> *)in_stack_fffffffffffffee0);
      local_78.i = (QByteArray *)0xaaaaaaaaaaaaaaaa;
      local_78 = QList<QByteArray>::end((QList<QByteArray> *)in_stack_fffffffffffffee0);
      while( true ) {
        local_80 = local_78.i;
        bVar1 = QList<QByteArray>::const_iterator::operator!=(&local_70,local_78);
        if (!bVar1) break;
        QList<QByteArray>::const_iterator::operator*(&local_70);
        local_88 = 0xaaaaaaaaaaaaaaaa;
        QString::fromLatin1<void>((QByteArray *)in_stack_fffffffffffffee0);
        QFlags<QDirListing::IteratorFlag>::QFlags
                  ((QFlags<QDirListing::IteratorFlag> *)in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffedc);
        QDirListing::QDirListing
                  ((QDirListing *)&local_88,(QString *)local_a0,(QList_conflict1 *)&local_68,
                   (QFlags *)(ulong)local_a4);
        QString::~QString((QString *)0x12664a);
        local_b0.dirListPtr =
             (QDirListingPrivate *)
             QDirListing::cbegin((QDirListing *)
                                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        QDirListing::cend((QDirListing *)in_stack_fffffffffffffee0);
        bVar1 = ::operator!=(&local_b0);
        if (bVar1) {
          QSslSocketPrivate::setRootCertOnDemandLoadingSupported(true);
        }
        QDirListing::~QDirListing((QDirListing *)&local_88);
        if (bVar1) break;
        QList<QByteArray>::const_iterator::operator++(&local_70);
      }
      uVar3 = QSslSocketPrivate::rootCertOnDemandLoadingSupported();
      if ((uVar3 & 1) == 0) {
        systemCaCertificates
                  ((QTlsBackendOpenSSL *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        QTlsBackend::setDefaultCaCertificates((QList_conflict1 *)local_c8);
        QList<QSslCertificate>::~QList((QList<QSslCertificate> *)0x1266ee);
      }
      QList<QString>::~QList((QList<QString> *)0x1266fb);
      QList<QByteArray>::~QList((QList<QByteArray> *)0x126708);
      QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/plugins/tls/openssl/qtlsbackend_openssl.cpp:195:30)>
      ::~QScopeGuard((QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_plugins_tls_openssl_qtlsbackend_openssl_cpp:195:30)>
                      *)in_stack_fffffffffffffee0);
    }
    QMutexLocker<QRecursiveMutex>::~QMutexLocker(in_stack_fffffffffffffee0);
  }
  if (*(QRecursiveMutex **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTlsBackendOpenSSL::ensureCiphersAndCertsLoaded() const
{
    Q_CONSTINIT static bool initializationStarted = false;
    Q_CONSTINIT static QAtomicInt initialized = Q_BASIC_ATOMIC_INITIALIZER(0);
    Q_CONSTINIT static QRecursiveMutex initMutex;

    if (initialized.loadAcquire())
        return;

    const QMutexLocker locker(&initMutex);

    if (initializationStarted || initialized.loadAcquire())
        return;

    // Indicate that the initialization has already started in the current
    // thread in case of recursive calls. The atomic variable cannot be used
    // for this because it is checked without holding the init mutex.
    initializationStarted = true;

    auto guard = qScopeGuard([] { initialized.storeRelease(1); });

    resetDefaultCiphers();
    resetDefaultEllipticCurves();

#if QT_CONFIG(library)
    //load symbols needed to receive certificates from system store
#if defined(Q_OS_QNX)
    QSslSocketPrivate::setRootCertOnDemandLoadingSupported(true);
#elif defined(Q_OS_UNIX) && !defined(Q_OS_DARWIN)
    // check whether we can enable on-demand root-cert loading (i.e. check whether the sym links are there)
    const QList<QByteArray> dirs = QSslSocketPrivate::unixRootCertDirectories();
    const QStringList symLinkFilter{
        u"[0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f].[0-9]"_s};
    for (const auto &dir : dirs) {
        QDirListing dirList(QString::fromLatin1(dir), symLinkFilter,
                            QDirListing::IteratorFlag::FilesOnly);
        if (dirList.cbegin() != dirList.cend()) { // Not empty
            QSslSocketPrivate::setRootCertOnDemandLoadingSupported(true);
            break;
        }
    }
#endif
#endif // QT_CONFIG(library)
    // if on-demand loading was not enabled, load the certs now
    if (!QSslSocketPrivate::rootCertOnDemandLoadingSupported())
        setDefaultCaCertificates(systemCaCertificates());
#ifdef Q_OS_WIN
    //Enabled for fetching additional root certs from windows update on windows.
    //This flag is set false by setDefaultCaCertificates() indicating the app uses
    //its own cert bundle rather than the system one.
    //Same logic that disables the unix on demand cert loading.
    //Unlike unix, we do preload the certificates from the cert store.
    QSslSocketPrivate::setRootCertOnDemandLoadingSupported(true);
#endif
}